

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O1

int mbedtls_gcm_auth_decrypt
              (mbedtls_gcm_context *ctx,size_t length,uchar *iv,size_t iv_len,uchar *add,
              size_t add_len,uchar *tag,size_t tag_len,uchar *input,uchar *output)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  uchar check_tag [16];
  
  iVar2 = mbedtls_gcm_crypt_and_tag
                    (ctx,0,length,iv,iv_len,add,add_len,input,output,tag_len,check_tag);
  if ((iVar2 == 0) && (iVar2 = 0, tag_len != 0)) {
    bVar1 = 0;
    sVar3 = 0;
    do {
      bVar1 = bVar1 | check_tag[sVar3] ^ tag[sVar3];
      sVar3 = sVar3 + 1;
    } while (tag_len != sVar3);
    if (bVar1 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = -0x12;
      if (length != 0) {
        sVar3 = 0;
        do {
          output[sVar3] = '\0';
          sVar3 = sVar3 + 1;
        } while (length != sVar3);
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_gcm_auth_decrypt( mbedtls_gcm_context *ctx,
                      size_t length,
                      const unsigned char *iv,
                      size_t iv_len,
                      const unsigned char *add,
                      size_t add_len,
                      const unsigned char *tag,
                      size_t tag_len,
                      const unsigned char *input,
                      unsigned char *output )
{
    int ret;
    unsigned char check_tag[16];
    size_t i;
    int diff;

    if( ( ret = mbedtls_gcm_crypt_and_tag( ctx, MBEDTLS_GCM_DECRYPT, length,
                                   iv, iv_len, add, add_len,
                                   input, output, tag_len, check_tag ) ) != 0 )
    {
        return( ret );
    }

    /* Check tag in "constant-time" */
    for( diff = 0, i = 0; i < tag_len; i++ )
        diff |= tag[i] ^ check_tag[i];

    if( diff != 0 )
    {
        mbedtls_zeroize( output, length );
        return( MBEDTLS_ERR_GCM_AUTH_FAILED );
    }

    return( 0 );
}